

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffdtdm(fitsfile *fptr,char *tdimstr,int colnum,int maxdim,int *naxis,long *naxes,int *status)

{
  char *pcVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int *in_RDI;
  int *in_R8;
  undefined8 *in_R9;
  tcolumn *colptr;
  char message [81];
  char *lastloc;
  char *loc;
  long totalpix;
  long dimsize;
  long local_b0;
  char local_a8 [88];
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  long lVar3;
  fitsfile *in_stack_ffffffffffffffc8;
  int local_4;
  
  lVar3 = 1;
  local_b0 = 0;
  if (0 < *(int *)colptr->ttype) {
    return *(int *)colptr->ttype;
  }
  if (in_EDX != 0) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffffc8,0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    if ((in_EDX < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < in_EDX)) {
      colptr->ttype[0] = '.';
      colptr->ttype[1] = '\x01';
      colptr->ttype[2] = '\0';
      colptr->ttype[3] = '\0';
      return 0x12e;
    }
    local_b0 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_EDX + -1) * 0xa0;
    if (*in_RSI == '\0') {
      *in_R8 = 1;
      if (0 < in_ECX) {
        *in_R9 = *(undefined8 *)(local_b0 + 0x58);
      }
      return *(int *)colptr->ttype;
    }
  }
  *in_R8 = 0;
  pcVar1 = strchr(in_RSI,0x28);
  if (pcVar1 == (char *)0x0) {
    snprintf(local_a8,0x51,"Illegal dimensions format: %s",in_RSI);
    colptr->ttype[0] = '\a';
    colptr->ttype[1] = '\x01';
    colptr->ttype[2] = '\0';
    colptr->ttype[3] = '\0';
    local_4 = 0x107;
  }
  else {
    while (pcVar1 != (char *)0x0) {
      in_stack_ffffffffffffffb0 = (int *)(pcVar1 + 1);
      lVar2 = strtol((char *)in_stack_ffffffffffffffb0,(char **)&stack0xffffffffffffffb8,10);
      if (*in_R8 < in_ECX) {
        in_R9[*in_R8] = lVar2;
      }
      if (lVar2 < 0) {
        ffpmsg((char *)0x1c0eaa);
        ffpmsg((char *)0x1c0eb7);
        colptr->ttype[0] = '\a';
        colptr->ttype[1] = '\x01';
        colptr->ttype[2] = '\0';
        colptr->ttype[3] = '\0';
        return 0x107;
      }
      lVar3 = lVar2 * lVar3;
      *in_R8 = *in_R8 + 1;
      pcVar1 = strchr((char *)in_stack_ffffffffffffffb0,0x2c);
    }
    pcVar1 = strchr((char *)in_stack_ffffffffffffffb0,0x29);
    if (pcVar1 == (char *)0x0) {
      snprintf(local_a8,0x51,"Illegal dimensions format: %s",in_RSI);
      colptr->ttype[0] = '\a';
      colptr->ttype[1] = '\x01';
      colptr->ttype[2] = '\0';
      colptr->ttype[3] = '\0';
      local_4 = 0x107;
    }
    else if (((in_EDX == 0) || (*(int *)(local_b0 + 0x50) < 1)) ||
            (*(long *)(local_b0 + 0x58) == lVar3)) {
      local_4 = *(int *)colptr->ttype;
    }
    else {
      snprintf(local_a8,0x51,"column vector length, %ld, does not equal TDIMn array size, %ld",
               *(undefined8 *)(local_b0 + 0x58),lVar3);
      ffpmsg((char *)0x1c0fc9);
      ffpmsg((char *)0x1c0fd6);
      colptr->ttype[0] = '\a';
      colptr->ttype[1] = '\x01';
      colptr->ttype[2] = '\0';
      colptr->ttype[3] = '\0';
      local_4 = 0x107;
    }
  }
  return local_4;
}

Assistant:

int ffdtdm(fitsfile *fptr,  /* I - FITS file pointer                        */
           char *tdimstr,   /* I - TDIMn keyword value string. e.g. (10,10) */
           int colnum,      /* I - number of the column             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  decode the TDIMnnn keyword to get the dimensionality of a column.
  Check that the value is legal and consistent with the TFORM value.
  If colnum = 0, then the validity checking is disabled.
*/
{
    long dimsize, totalpix = 1;
    char *loc, *lastloc, message[FLEN_ERRMSG];
    tcolumn *colptr = 0;

    if (*status > 0)
        return(*status);

    if (colnum != 0) {
        if (fptr->HDUposition != (fptr->Fptr)->curhdu)
            ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

        if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
            return(*status = BAD_COL_NUM);

        colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
        colptr += (colnum - 1);    /* increment to the correct column */

        if (!tdimstr[0])   /* TDIMn keyword doesn't exist? */
        {
            *naxis = 1;                   /* default = 1 dimensional */
            if (maxdim > 0)
                naxes[0] = (long) colptr->trepeat; /* default length = repeat */

            return(*status);
        }
    }

    *naxis = 0;

    loc = strchr(tdimstr, '(' );  /* find the opening quote */
    if (!loc)
    {
            snprintf(message, FLEN_ERRMSG, "Illegal dimensions format: %s", tdimstr);
            return(*status = BAD_TDIM);
    }

    while (loc)
    {
            loc++;
            dimsize = strtol(loc, &loc, 10);  /* read size of next dimension */
            if (*naxis < maxdim)
                naxes[*naxis] = dimsize;

            if (dimsize < 0)
            {
                ffpmsg("one or more dimension are less than 0 (ffdtdm)");
                ffpmsg(tdimstr);
                return(*status = BAD_TDIM);
            }

            totalpix *= dimsize;
            (*naxis)++;
            lastloc = loc;
            loc = strchr(loc, ',');  /* look for comma before next dimension */
    }

    loc = strchr(lastloc, ')' );  /* check for the closing quote */
    if (!loc)
    {
            snprintf(message, FLEN_ERRMSG, "Illegal dimensions format: %s", tdimstr);
            return(*status = BAD_TDIM);
    }

    if (colnum != 0) {
        if ((colptr->tdatatype > 0) && ((long) colptr->trepeat != totalpix))
        {
          snprintf(message, FLEN_ERRMSG,
          "column vector length, %ld, does not equal TDIMn array size, %ld",
          (long) colptr->trepeat, totalpix);
          ffpmsg(message);
          ffpmsg(tdimstr);
          return(*status = BAD_TDIM);
        }
    }
    return(*status);
}